

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O0

Vec_Ptr_t * Bac_PtrDeriveFromCba(Bac_Man_t *p)

{
  int iVar1;
  Bac_Ntk_t *p_00;
  Vec_Ptr_t *Entry;
  int local_2c;
  int i;
  Bac_Ntk_t *pTemp;
  Vec_Ptr_t *vDes;
  Bac_Man_t *p_local;
  
  if (p == (Bac_Man_t *)0x0) {
    p_local = (Bac_Man_t *)0x0;
  }
  else if (p->pMioLib == (void *)0x0) {
    printf("Cannot transform CBA network into Ptr because it is not mapped.\n");
    p_local = (Bac_Man_t *)0x0;
  }
  else {
    Bac_ManAssignInternWordNames(p);
    iVar1 = Bac_ManNtkNum(p);
    p_local = (Bac_Man_t *)Vec_PtrAllocExact(iVar1 + 1);
    Vec_PtrPush((Vec_Ptr_t *)p_local,p->pName);
    for (local_2c = 1; iVar1 = Bac_ManNtkNum(p), local_2c <= iVar1; local_2c = local_2c + 1) {
      p_00 = Bac_ManNtk(p,local_2c);
      Entry = Bac_NtkTransformToPtr(p_00);
      Vec_PtrPush((Vec_Ptr_t *)p_local,Entry);
    }
    iVar1 = Ptr_CheckArray((Vec_Ptr_t *)p_local);
    if (iVar1 == 0) {
      __assert_fail("Ptr_CheckArray(vDes)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                    ,0x1db,"Vec_Ptr_t *Bac_PtrDeriveFromCba(Bac_Man_t *)");
    }
  }
  return (Vec_Ptr_t *)p_local;
}

Assistant:

Vec_Ptr_t * Bac_PtrDeriveFromCba( Bac_Man_t * p )
{
    Vec_Ptr_t * vDes;
    Bac_Ntk_t * pTemp; int i;
    if ( p == NULL )
        return NULL;
    if ( p->pMioLib == NULL )
    {
        printf( "Cannot transform CBA network into Ptr because it is not mapped.\n" );
        return NULL;
    }
    Bac_ManAssignInternWordNames( p );
    vDes = Vec_PtrAllocExact( 1 + Bac_ManNtkNum(p) );
    Vec_PtrPush( vDes, p->pName );
    Bac_ManForEachNtk( p, pTemp, i )
        Vec_PtrPush( vDes, Bac_NtkTransformToPtr(pTemp) );
    assert( Ptr_CheckArray(vDes) );
    return vDes;
}